

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

bool __thiscall deqp::gls::DrawTestSpec::AttributeSpec::valid(AttributeSpec *this,ApiType ctxType)

{
  InputType IVar1;
  OutputType OVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  
  IVar1 = this->inputType;
  bVar4 = (byte)IVar1;
  OVar2 = this->outputType;
  bVar6 = (byte)(0x1d0 >> ((byte)OVar2 & 0x1f)) & OVar2 < OUTPUTTYPE_UVEC2;
  bVar5 = (byte)(0xe20 >> ((byte)OVar2 & 0x1f)) & OVar2 < OUTPUTTYPE_LAST;
  if (this->useDefaultAttribute == true) {
    if (INPUTTYPE_UNSIGNED_INT < IVar1) {
      return false;
    }
    if ((0x181U >> (IVar1 & 0x1f) & 1) == 0) {
      return false;
    }
    if ((IVar1 == INPUTTYPE_UNSIGNED_INT & (bVar5 ^ 1)) != 0) {
      return false;
    }
    if (IVar1 == INPUTTYPE_INT && bVar6 == 0) {
      return false;
    }
    if (IVar1 != INPUTTYPE_FLOAT && this->componentCount != 4) {
      return false;
    }
  }
  bVar7 = IVar1 - INPUTTYPE_UNSIGNED_INT_2_10_10_10 < 2;
  if (bVar7 && OUTPUTTYPE_VEC4 < OVar2) {
    return false;
  }
  if ((IVar1 < INPUTTYPE_LAST & (byte)(0x898 >> (bVar4 & 0x1f)) & bVar5) != 0) {
    return false;
  }
  if ((IVar1 < INPUTTYPE_INT_2_10_10_10 & (byte)(0x560 >> (bVar4 & 0x1f)) & bVar6) != 0) {
    return false;
  }
  if ((INPUTTYPE_HALF < IVar1 || (0x1fcU >> (bVar4 & 0x1f) & 1) != 0) || OUTPUTTYPE_VEC4 >= OVar2) {
    if (bVar7 && this->componentCount != 4) {
      return false;
    }
    if (((OUTPUTTYPE_VEC4 < OVar2 & this->normalize) == 0) &&
       (bVar7 = this->bgraComponentOrder, (byte)(bVar7 ^ 1U | this->componentCount == 4) == 1)) {
      if (bVar7 != false) {
        if (INPUTTYPE_INT_2_10_10_10 < IVar1) {
          return false;
        }
        if ((0xc20U >> (IVar1 & 0x1f) & 1) == 0) {
          return false;
        }
      }
      if ((this->normalize == false & bVar7) == 0) {
        if (ctxType.m_bits == 2) {
          if (INPUTTYPE_UNSIGNED_SHORT < IVar1) {
            return false;
          }
          if (IVar1 == INPUTTYPE_DOUBLE) {
            return false;
          }
          if (OUTPUTTYPE_VEC4 < OVar2 || bVar7 != false) {
            return false;
          }
        }
        uVar3 = ctxType.m_bits >> 8 & 3;
        if (((((ctxType.m_bits & 0xf) == 3 && uVar3 == 0) & bVar7) == 0) &&
           (((uVar3 != 1 || (this->useDefaultAttribute != false)) || (this->storage != STORAGE_USER)
            ))) {
          return true;
        }
      }
    }
    return false;
  }
  return false;
}

Assistant:

bool DrawTestSpec::AttributeSpec::valid (glu::ApiType ctxType) const
{
	const bool inputTypeFloat				= inputType == DrawTestSpec::INPUTTYPE_FLOAT || inputType  == DrawTestSpec::INPUTTYPE_FIXED || inputType == DrawTestSpec::INPUTTYPE_HALF;
	const bool inputTypeUnsignedInteger		= inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE || inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT || inputType  == DrawTestSpec::INPUTTYPE_UNSIGNED_INT || inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10;
	const bool inputTypeSignedInteger		= inputType == DrawTestSpec::INPUTTYPE_BYTE  || inputType == DrawTestSpec::INPUTTYPE_SHORT || inputType == DrawTestSpec::INPUTTYPE_INT || inputType == DrawTestSpec::INPUTTYPE_INT_2_10_10_10;
	const bool inputTypePacked				= inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || inputType == DrawTestSpec::INPUTTYPE_INT_2_10_10_10;

	const bool outputTypeFloat				= outputType == DrawTestSpec::OUTPUTTYPE_FLOAT || outputType == DrawTestSpec::OUTPUTTYPE_VEC2  || outputType == DrawTestSpec::OUTPUTTYPE_VEC3  || outputType == DrawTestSpec::OUTPUTTYPE_VEC4;
	const bool outputTypeSignedInteger		= outputType == DrawTestSpec::OUTPUTTYPE_INT   || outputType == DrawTestSpec::OUTPUTTYPE_IVEC2 || outputType == DrawTestSpec::OUTPUTTYPE_IVEC3 || outputType == DrawTestSpec::OUTPUTTYPE_IVEC4;
	const bool outputTypeUnsignedInteger	= outputType == DrawTestSpec::OUTPUTTYPE_UINT  || outputType == DrawTestSpec::OUTPUTTYPE_UVEC2 || outputType == DrawTestSpec::OUTPUTTYPE_UVEC3 || outputType == DrawTestSpec::OUTPUTTYPE_UVEC4;

	if (useDefaultAttribute)
	{
		if (inputType != DrawTestSpec::INPUTTYPE_INT && inputType != DrawTestSpec::INPUTTYPE_UNSIGNED_INT && inputType != DrawTestSpec::INPUTTYPE_FLOAT)
			return false;

		if (inputType != DrawTestSpec::INPUTTYPE_FLOAT && componentCount != 4)
			return false;

		// no casting allowed (undefined results)
		if (inputType == DrawTestSpec::INPUTTYPE_INT && !outputTypeSignedInteger)
			return false;
		if (inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_INT && !outputTypeUnsignedInteger)
			return false;
	}

	if (inputTypePacked && componentCount != 4)
		return false;

	// Invalid conversions:

	// float -> [u]int
	if (inputTypeFloat && !outputTypeFloat)
		return false;

	// uint -> int		(undefined results)
	if (inputTypeUnsignedInteger && outputTypeSignedInteger)
		return false;

	// int -> uint		(undefined results)
	if (inputTypeSignedInteger && outputTypeUnsignedInteger)
		return false;

	// packed -> non-float (packed formats are converted to floats)
	if (inputTypePacked && !outputTypeFloat)
		return false;

	// Invalid normalize. Normalize is only valid if output type is float
	if (normalize && !outputTypeFloat)
		return false;

	// Allow reverse order (GL_BGRA) only for packed and 4-component ubyte
	if (bgraComponentOrder && componentCount != 4)
		return false;
	if (bgraComponentOrder && inputType != DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10 && inputType != DrawTestSpec::INPUTTYPE_INT_2_10_10_10 && inputType != DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE)
		return false;
	if (bgraComponentOrder && normalize != true)
		return false;

	// GLES2 limits
	if (ctxType == glu::ApiType::es(2,0))
	{
		if (inputType != DrawTestSpec::INPUTTYPE_FLOAT && inputType != DrawTestSpec::INPUTTYPE_FIXED &&
			inputType != DrawTestSpec::INPUTTYPE_BYTE  && inputType != DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE &&
			inputType != DrawTestSpec::INPUTTYPE_SHORT && inputType != DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT)
			return false;

		if (!outputTypeFloat)
			return false;

		if (bgraComponentOrder)
			return false;
	}

	// GLES3 limits
	if (ctxType.getProfile() == glu::PROFILE_ES && ctxType.getMajorVersion() == 3)
	{
		if (bgraComponentOrder)
			return false;
	}

	// No user pointers in GL core
	if (ctxType.getProfile() == glu::PROFILE_CORE)
	{
		if (!useDefaultAttribute && storage == DrawTestSpec::STORAGE_USER)
			return false;
	}

	return true;
}